

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::sectionNodeOf(BaseBuilder *this,SectionNode **out,uint32_t sectionId)

{
  ZoneVector<asmjit::v1_14::SectionNode_*> *this_00;
  CodeHolder *pCVar1;
  Error extraout_EAX;
  Error EVar2;
  Error EVar3;
  SectionNode *pSVar4;
  BaseNode *extraout_RAX;
  ZoneAllocator *allocator;
  BaseBuilder *this_01;
  BaseNode *pBStack_60;
  SectionNode **ppSStack_58;
  ulong uStack_50;
  ZoneAllocator *local_40;
  size_t local_38;
  
  *out = (SectionNode *)0x0;
  pCVar1 = (this->super_BaseEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    return 5;
  }
  if (*(uint *)&pCVar1->field_0xe0 <= sectionId) {
    EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,0x13,(char *)0x0);
    return EVar3;
  }
  this_00 = &this->_sectionNodes;
  allocator = (ZoneAllocator *)out;
  this_01 = this;
  if (*(uint *)&this->field_0x180 <= sectionId) {
    EVar3 = 0;
    if (*(uint *)&this->field_0x184 < sectionId + 1) {
      allocator = &this->_allocator;
      uStack_50 = 0x1170f9;
      this_01 = (BaseBuilder *)this_00;
      EVar3 = ZoneVectorBase::_reserve((ZoneVectorBase *)this_00,allocator,8,sectionId + 1);
    }
    if (EVar3 != 0) {
      uStack_50 = 0x11710e;
      EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar3,(char *)0x0);
      return EVar3;
    }
  }
  if (sectionId < *(uint *)&this->field_0x180) {
    pSVar4 = *(SectionNode **)(*(long *)&this_00->field_0x0 + (ulong)sectionId * 8);
  }
  else {
    pSVar4 = (SectionNode *)0x0;
  }
  if (pSVar4 != (SectionNode *)0x0) goto LAB_00116ff5;
  if (*(long *)&this->_allocator == 0) {
    uStack_50 = 0x11711a;
    sectionNodeOf();
    EVar3 = extraout_EAX;
LAB_0011711a:
    EVar2 = EVar3;
    pSVar4 = (SectionNode *)0x0;
  }
  else {
    this_01 = (BaseBuilder *)&this->_allocator;
    allocator = (ZoneAllocator *)0x40;
    uStack_50 = 0x117025;
    local_40 = (ZoneAllocator *)this_01;
    pSVar4 = (SectionNode *)ZoneAllocator::_alloc((ZoneAllocator *)this_01,0x40,&local_38);
    EVar2 = 0;
    EVar3 = 0;
    if (pSVar4 == (SectionNode *)0x0) goto LAB_0011711a;
    *(undefined8 *)pSVar4 = 0;
    *(undefined8 *)(pSVar4 + 8) = 0;
    pSVar4[0x10] = (SectionNode)0x2;
    pSVar4[0x11] = (SectionNode)(this->_nodeFlags | kHasNoEffect);
    *(undefined8 *)(pSVar4 + 0x12) = 0;
    *(undefined8 *)(pSVar4 + 0x1a) = 0;
    *(undefined8 *)(pSVar4 + 0x20) = 0;
    *(undefined8 *)(pSVar4 + 0x28) = 0;
    *(uint32_t *)(pSVar4 + 0x30) = sectionId;
    *(undefined8 *)(pSVar4 + 0x38) = 0;
  }
  if (pSVar4 == (SectionNode *)0x0) {
    allocator = (ZoneAllocator *)0x1;
    uStack_50 = 0x117131;
    this_01 = this;
    EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  }
  if (EVar2 != 0) {
    return EVar2;
  }
  if (*(uint *)&this->field_0x180 <= sectionId) {
    uStack_50 = 0x1170a4;
    allocator = local_40;
    this_01 = (BaseBuilder *)this_00;
    ZoneVectorBase::_resize((ZoneVectorBase *)this_00,local_40,8,sectionId + 1);
  }
  if (*(uint *)&this->field_0x180 <= sectionId) {
    uStack_50 = 0x11713b;
    sectionNodeOf();
    pBStack_60 = extraout_RAX;
    ppSStack_58 = out;
    uStack_50 = (ulong)sectionId;
    EVar3 = sectionNodeOf(this_01,(SectionNode **)&pBStack_60,*(uint32_t *)&allocator->field_0x0);
    if (EVar3 == 0) {
      if ((char)pBStack_60[0x11] < '\0') {
        if (this_01->_dirtySectionLinks == true) {
          updateSectionLinks(this_01);
        }
        if (*(undefined8 **)(pBStack_60 + 0x38) == (undefined8 *)0x0) {
          pBStack_60 = *(BaseNode **)&this_01->field_0x1a8;
        }
        else {
          pBStack_60 = (BaseNode *)**(undefined8 **)(pBStack_60 + 0x38);
        }
      }
      else {
        addAfter(this_01,pBStack_60,*(BaseNode **)&this_01->field_0x1a8);
      }
      this_01->_cursor = pBStack_60;
      EVar3 = 0;
    }
    return EVar3;
  }
  *(SectionNode **)(*(long *)&this_00->field_0x0 + (ulong)sectionId * 8) = pSVar4;
LAB_00116ff5:
  *out = pSVar4;
  return 0;
}

Assistant:

Error BaseBuilder::sectionNodeOf(SectionNode** out, uint32_t sectionId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!_code->isSectionValid(sectionId)))
    return reportError(DebugUtils::errored(kErrorInvalidSection));

  if (sectionId >= _sectionNodes.size()) {
    Error err = _sectionNodes.reserve(&_allocator, sectionId + 1);
    if (ASMJIT_UNLIKELY(err != kErrorOk))
      return reportError(err);
  }

  SectionNode* node = nullptr;
  if (sectionId < _sectionNodes.size())
    node = _sectionNodes[sectionId];

  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<SectionNode>(&node, sectionId));

    // We have already reserved enough space, this cannot fail now.
    if (sectionId >= _sectionNodes.size())
      _sectionNodes.resize(&_allocator, sectionId + 1);

    _sectionNodes[sectionId] = node;
  }

  *out = node;
  return kErrorOk;
}